

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O3

void __thiscall
QAbstractItemModelPrivate::itemsMoved
          (QAbstractItemModelPrivate *this,QModelIndex *sourceParent,int sourceFirst,int sourceLast,
          QModelIndex *destinationParent,int destinationChild,Orientation orientation)

{
  QStack<QList<QPersistentModelIndexData_*>_> *this_00;
  QArrayData *pQVar1;
  iterator iVar2;
  uint uVar3;
  int change;
  int iVar4;
  int change_00;
  long in_FS_OFFSET;
  bool bVar5;
  value_type v_2;
  value_type v_1;
  value_type v;
  QList<QPersistentModelIndexData_*> local_90;
  QList<QPersistentModelIndexData_*> local_78;
  QList<QPersistentModelIndexData_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->persistent).moved;
  iVar2 = QList<QList<QPersistentModelIndexData_*>_>::end
                    (&this_00->super_QList<QList<QPersistentModelIndexData_*>_>);
  local_58.d.d = iVar2.i[-1].d.d;
  local_58.d.ptr = iVar2.i[-1].d.ptr;
  iVar2.i[-1].d.d = (Data *)0x0;
  iVar2.i[-1].d.ptr = (QPersistentModelIndexData **)0x0;
  local_58.d.size = iVar2.i[-1].d.size;
  iVar2.i[-1].d.size = 0;
  QtPrivate::QGenericArrayOps<QList<QPersistentModelIndexData_*>_>::eraseLast
            ((QGenericArrayOps<QList<QPersistentModelIndexData_*>_> *)this_00);
  iVar2 = QList<QList<QPersistentModelIndexData_*>_>::end
                    (&this_00->super_QList<QList<QPersistentModelIndexData_*>_>);
  local_78.d.d = iVar2.i[-1].d.d;
  local_78.d.ptr = iVar2.i[-1].d.ptr;
  iVar2.i[-1].d.d = (Data *)0x0;
  iVar2.i[-1].d.ptr = (QPersistentModelIndexData **)0x0;
  local_78.d.size = iVar2.i[-1].d.size;
  iVar2.i[-1].d.size = 0;
  QtPrivate::QGenericArrayOps<QList<QPersistentModelIndexData_*>_>::eraseLast
            ((QGenericArrayOps<QList<QPersistentModelIndexData_*>_> *)this_00);
  iVar2 = QList<QList<QPersistentModelIndexData_*>_>::end
                    (&this_00->super_QList<QList<QPersistentModelIndexData_*>_>);
  pQVar1 = &(iVar2.i[-1].d.d)->super_QArrayData;
  iVar2.i[-1].d.d = (Data *)0x0;
  local_90.d.ptr = iVar2.i[-1].d.ptr;
  iVar2.i[-1].d.ptr = (QPersistentModelIndexData **)0x0;
  local_90.d.size = iVar2.i[-1].d.size;
  iVar2.i[-1].d.size = 0;
  local_90.d.d = (Data *)pQVar1;
  QtPrivate::QGenericArrayOps<QList<QPersistentModelIndexData_*>_>::eraseLast
            ((QGenericArrayOps<QList<QPersistentModelIndexData_*>_> *)this_00);
  bVar5 = true;
  if (((sourceParent->r == destinationParent->r) && (sourceParent->c == destinationParent->c)) &&
     (sourceParent->i == destinationParent->i)) {
    bVar5 = (sourceParent->m).ptr != (destinationParent->m).ptr;
  }
  uVar3 = ~sourceLast;
  if (bVar5) {
    uVar3 = -sourceFirst;
  }
  if (destinationChild < sourceFirst) {
    uVar3 = -sourceFirst;
  }
  movePersistentIndexes(this,&local_90,uVar3 + destinationChild,destinationParent,orientation);
  change_00 = (sourceLast - sourceFirst) + 1;
  iVar4 = ~sourceLast + sourceFirst;
  change = iVar4;
  if (destinationChild < sourceFirst) {
    change = change_00;
  }
  if (bVar5) {
    change = iVar4;
  }
  movePersistentIndexes(this,&local_78,change,sourceParent,orientation);
  movePersistentIndexes(this,&local_58,change_00,destinationParent,orientation);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&pQVar1->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar1->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QArrayData *)&pQVar1->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        return;
      }
      goto LAB_00445412;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00445412:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelPrivate::itemsMoved(const QModelIndex &sourceParent, int sourceFirst, int sourceLast, const QModelIndex &destinationParent, int destinationChild, Qt::Orientation orientation)
{
    const QList<QPersistentModelIndexData *> moved_in_destination = persistent.moved.pop();
    const QList<QPersistentModelIndexData *> moved_in_source = persistent.moved.pop();
    const QList<QPersistentModelIndexData *> moved_explicitly = persistent.moved.pop();

    const bool sameParent = (sourceParent == destinationParent);
    const bool movingUp = (sourceFirst > destinationChild);

    const int explicit_change = (!sameParent || movingUp) ? destinationChild - sourceFirst : destinationChild - sourceLast - 1 ;
    const int source_change = (!sameParent || !movingUp) ? -1*(sourceLast - sourceFirst + 1) : sourceLast - sourceFirst + 1 ;
    const int destination_change = sourceLast - sourceFirst + 1;

    movePersistentIndexes(moved_explicitly, explicit_change, destinationParent, orientation);
    movePersistentIndexes(moved_in_source, source_change, sourceParent, orientation);
    movePersistentIndexes(moved_in_destination, destination_change, destinationParent, orientation);
}